

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O1

void __thiscall
RasterizerA3<8U>::_addLine<long>(RasterizerA3<8U> *this,long x0,long y0,long x1,long y1)

{
  int32_t *piVar1;
  ulong *puVar2;
  BitWord *pBVar3;
  Cell *pCVar4;
  Cell *pCVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  ulong *__s;
  int iVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  int iVar36;
  ulong uVar37;
  bool bVar38;
  int local_e0;
  uint local_dc;
  ulong local_d8;
  long local_a8;
  ulong local_a0;
  long local_90;
  int local_80;
  
  uVar7 = y1 - y0;
  if (uVar7 != 0) {
    uVar16 = x1 - x0;
    uVar24 = -uVar16;
    if (0 < (long)uVar16) {
      uVar24 = uVar16;
    }
    uVar16 = -uVar7;
    if (0 < (long)uVar7) {
      uVar16 = uVar7;
    }
    if (x1 < x0) {
      local_e0 = -1;
      local_a0 = x1;
      uVar34 = y1;
      local_90 = x0;
    }
    else {
      local_e0 = 1;
      local_a0 = x0;
      uVar34 = y0;
      y0 = y1;
      local_90 = x1;
    }
    if (y0 < (long)uVar34) {
      uVar33 = uVar34 ^ 0xff;
      lVar28 = (ulong)((char)uVar33 != -1) * 0x200;
      uVar34 = (uVar33 + lVar28) - 0x1ff;
      y0 = (uVar16 + lVar28 + uVar33) - 0x1ff;
      local_e0 = -local_e0;
      iVar13 = -1;
    }
    else {
      iVar13 = 1;
    }
    local_d8 = local_a0 >> 8;
    uVar19 = (uint)local_a0 & 0xff;
    uVar33 = (ulong)uVar19;
    uVar37 = uVar34 >> 8;
    uVar31 = (uint)(uVar34 >> 8);
    iVar26 = (int)((ulong)y0 >> 8) - uVar31;
    uVar32 = (uint)(local_a0 >> 8);
    if ((int)((int)uVar24 + uVar19) < 0x101 && iVar26 == 0) {
      uVar30 = (this->_yBounds).start;
      uVar14 = (this->_yBounds).end;
      if ((int)uVar31 <= (int)uVar30) {
        uVar30 = uVar31;
      }
      (this->_yBounds).start = uVar30;
      if ((int)uVar14 <= (int)uVar31) {
        uVar14 = uVar31;
      }
      (this->_yBounds).end = uVar14;
      this->_bits
      [(long)(int)uVar31 * this->_bitStride + (ulong)((uint)(local_a0 >> 0x11) & 0x7fffff)] =
           this->_bits
           [(long)(int)uVar31 * this->_bitStride + (ulong)((uint)(local_a0 >> 0x11) & 0x7fffff)] |
           1L << ((byte)(local_a0 >> 0xb) & 0x3f);
      if (((int)uVar32 < 0) || ((this->super_CellRasterizer).super_Rasterizer._width <= (int)uVar32)
         ) goto LAB_00108f20;
      if (((int)uVar31 < 0) ||
         ((this->super_CellRasterizer).super_Rasterizer._height <= (int)uVar31)) {
LAB_00108f3f:
        __assert_fail("y >= 0 && y < _height",
                      "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                      ,0x20,"void RasterizerA3<8>::_mergeCell(int, int, int, int) [N = 8]");
      }
      lVar28 = (uVar37 & 0x7fffffff) * this->_cellStride;
      pCVar5 = this->_cells;
      pCVar4 = pCVar5 + lVar28 + (local_d8 & 0x7fffffff);
      pCVar4->cover = pCVar4->cover + (int)uVar7;
      piVar1 = &pCVar5[lVar28 + (local_d8 & 0x7fffffff)].area;
      *piVar1 = *piVar1 + ((int)uVar24 + uVar19 * 2) * (int)uVar7;
    }
    else {
      uVar30 = (uint)uVar34 & 0xff;
      uVar35 = (uint)y0 & 0xff;
      uVar22 = ((iVar26 + 1) - (uint)((y0 & 0xffU) == 0)) * iVar13 + uVar31;
      uVar14 = uVar31;
      if (uVar22 < uVar31) {
        uVar14 = uVar22;
      }
      if (uVar31 < uVar22) {
        uVar31 = uVar22;
      }
      uVar6 = (this->_yBounds).start;
      uVar20 = (this->_yBounds).end;
      if ((int)uVar6 < (int)uVar14) {
        uVar14 = uVar6;
      }
      (this->_yBounds).start = uVar14;
      if ((int)uVar31 < (int)uVar20) {
        uVar31 = uVar20;
      }
      (this->_yBounds).end = uVar31;
      if (x1 != x0) {
        uVar8 = (uVar24 << 8) / uVar16;
        uVar17 = (uVar24 << 8) % uVar16;
        uVar18 = (uVar16 << 8) % uVar24;
        uVar9 = 0;
        uVar7 = uVar24;
        local_dc = uVar35;
        if (iVar26 != 0) {
          uVar9 = (0x100 - uVar30) * uVar24;
          uVar7 = uVar9 / uVar16;
          uVar9 = uVar9 % uVar16;
          local_dc = 0x100;
        }
        if (uVar32 == (uint)((ulong)local_90 >> 8)) {
          uVar10 = 0;
          uVar11 = uVar16;
        }
        else {
          uVar10 = (0x100 - uVar19) * uVar16;
          uVar11 = uVar10 / uVar24;
          uVar10 = uVar10 % uVar24;
        }
        lVar28 = uVar10 - (uVar24 >> 1);
        local_a8 = uVar9 - (uVar16 >> 1);
        local_80 = (int)((uVar16 << 8) / uVar24);
        if (uVar24 <= uVar16) {
          uVar31 = (int)uVar11 + (uint)uVar34;
          iVar23 = 1;
LAB_00108811:
          pBVar3 = this->_bits;
          pCVar4 = this->_cells;
          lVar25 = (long)(int)uVar37;
          iVar27 = uVar22 - (iVar13 + (int)uVar37);
          do {
            iVar15 = (int)uVar33;
            uVar19 = (int)uVar7 + iVar15;
            iVar36 = (int)local_d8;
            if ((int)uVar19 < 0x101) {
              pBVar3[this->_bitStride * lVar25 + (local_d8 >> 9 & 0x7fffff)] =
                   pBVar3[this->_bitStride * lVar25 + (local_d8 >> 9 & 0x7fffff)] |
                   1L << ((byte)(local_d8 >> 3) & 0x3f);
              if ((iVar36 < 0) || ((this->super_CellRasterizer).super_Rasterizer._width <= iVar36))
              goto LAB_00108f20;
              if ((lVar25 < 0) || ((this->super_CellRasterizer).super_Rasterizer._height <= lVar25))
              goto LAB_00108f3f;
              iVar12 = (local_dc - uVar30) * local_e0;
              lVar21 = this->_cellStride * lVar25;
              pCVar4[lVar21 + (local_d8 & 0xffffffff)].cover =
                   pCVar4[lVar21 + (local_d8 & 0xffffffff)].cover + iVar12;
              pCVar4[lVar21 + (local_d8 & 0xffffffff)].area =
                   pCVar4[lVar21 + (local_d8 & 0xffffffff)].area + (iVar15 + uVar19) * iVar12;
              if (uVar19 == 0x100) {
                local_d8 = (ulong)(iVar36 + 1);
                uVar19 = 0;
                goto LAB_001089cc;
              }
              uVar33 = (ulong)uVar19;
            }
            else {
              pBVar3[this->_bitStride * lVar25 + (local_d8 >> 9 & 0x7fffff)] =
                   pBVar3[this->_bitStride * lVar25 + (local_d8 >> 9 & 0x7fffff)] |
                   1L << ((byte)(local_d8 >> 3) & 0x3f);
              if ((iVar36 < 0) || ((this->super_CellRasterizer).super_Rasterizer._width <= iVar36))
              goto LAB_00108f20;
              if ((lVar25 < 0) || ((this->super_CellRasterizer).super_Rasterizer._height <= lVar25))
              goto LAB_00108f3f;
              uVar31 = uVar31 & 0xff;
              iVar12 = (uVar31 - uVar30) * local_e0;
              lVar21 = this->_cellStride * lVar25;
              pCVar4[lVar21 + (local_d8 & 0xffffffff)].cover =
                   pCVar4[lVar21 + (local_d8 & 0xffffffff)].cover + iVar12;
              pCVar4[lVar21 + (local_d8 & 0xffffffff)].area =
                   pCVar4[lVar21 + (local_d8 & 0xffffffff)].area + (iVar15 + 0x100) * iVar12;
              uVar32 = iVar36 + 1;
              local_d8 = (ulong)uVar32;
              pBVar3[this->_bitStride * lVar25 + (ulong)(uVar32 >> 9)] =
                   pBVar3[this->_bitStride * lVar25 + (ulong)(uVar32 >> 9)] |
                   1L << ((byte)(uVar32 >> 3) & 0x3f);
              if ((this->super_CellRasterizer).super_Rasterizer._width <= (int)uVar32)
              goto LAB_00108f20;
              if ((this->super_CellRasterizer).super_Rasterizer._height <= lVar25)
              goto LAB_00108f3f;
              uVar19 = uVar19 & 0xff;
              iVar15 = (local_dc - uVar31) * local_e0;
              lVar21 = this->_cellStride * lVar25;
              pCVar4[lVar21 + local_d8].cover = pCVar4[lVar21 + local_d8].cover + iVar15;
              pCVar4[lVar21 + local_d8].area = pCVar4[lVar21 + local_d8].area + iVar15 * uVar19;
LAB_001089cc:
              uVar33 = (ulong)uVar19;
              uVar31 = uVar31 + local_80;
              lVar28 = lVar28 + uVar18;
              if (-1 < lVar28) {
                lVar28 = lVar28 - uVar24;
                uVar31 = uVar31 + 1;
              }
            }
            iVar23 = iVar23 + -1;
            if (iVar23 != 0) goto LAB_00108a5b;
            if (iVar27 == 0) {
              return;
            }
            if (1 < iVar26) goto LAB_00108a3b;
            lVar25 = lVar25 + iVar13;
            uVar7 = local_90 - (uVar33 + (uint)((int)local_d8 << 8));
            iVar27 = iVar27 - iVar13;
            uVar30 = 0;
            iVar23 = iVar26;
            local_dc = uVar35;
            iVar26 = 1;
          } while( true );
        }
        uVar31 = uVar30 + (int)uVar11;
        iVar23 = 1;
        if ((int)((int)uVar7 + uVar19) < 0x101) {
          local_a0 = local_a0 + uVar7;
          iVar27 = (local_dc - uVar30) * local_e0;
          iVar15 = ((int)uVar7 + uVar19 * 2) * iVar27;
          iVar23 = 0;
          goto LAB_00108ac8;
        }
        while( true ) {
          uVar30 = (uint)uVar11;
          local_a0 = local_a0 + uVar7;
          uVar32 = (uint)local_d8;
          uVar19 = (uint)(local_a0 >> 8);
          if (uVar32 == uVar19) {
            __assert_fail("ex0 != ex1",
                          "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                          ,0x1e7,
                          "void RasterizerA3<8>::_addLine(Fixed, Fixed, Fixed, Fixed) [N = 8, Fixed = long]"
                         );
          }
          bVar38 = (local_a0 & 0xff) != 0;
          uVar14 = 0x100;
          if (bVar38) {
            uVar14 = (uint)local_a0 & 0xff;
          }
          uVar19 = bVar38 + uVar19;
          iVar27 = ((int)uVar33 + 0x100) * uVar30;
          uVar7 = local_d8 >> 3 & 0x1fffffff;
          uVar6 = (uint)uVar7;
          uVar20 = ((uVar19 >> 3) - uVar6) + 1;
          uVar34 = (ulong)uVar20;
          iVar15 = (int)uVar37;
          if (uVar20 != 0) {
            lVar25 = (long)iVar15 * this->_bitStride;
            pBVar3 = this->_bits;
            uVar7 = uVar7 >> 6;
            uVar6 = uVar6 & 0x3f;
            uVar33 = 0x40 - (ulong)uVar6;
            if (uVar34 <= uVar33) {
              uVar33 = uVar34;
            }
            puVar2 = pBVar3 + lVar25 + uVar7;
            __s = puVar2 + 1;
            *puVar2 = *puVar2 | (0xffffffffffffffffU >> (-(char)uVar33 & 0x3fU)) << (sbyte)uVar6;
            uVar9 = uVar34 - uVar33;
            if (0x3f < uVar9) {
              uVar34 = (uVar34 - uVar33) - 0x40;
              uVar33 = uVar34 >> 6;
              memset(__s,0xff,uVar33 * 8 + 8);
              uVar9 = (ulong)((uint)uVar34 & 0x3f);
              __s = pBVar3 + lVar25 + uVar33 + uVar7 + 2;
            }
            if (uVar9 != 0) {
              *__s = *__s | 0xffffffffffffffffU >> (-(char)uVar9 & 0x3fU);
            }
          }
          uVar19 = uVar19 - 1;
          if (uVar32 != uVar19) {
            pCVar4 = this->_cells;
            lVar21 = this->_cellStride * (uVar37 & 0xffffffff);
            local_d8 = local_d8 & 0xffffffff;
            lVar25 = 0;
            do {
              if (((int)uVar32 < 0) ||
                 ((this->super_CellRasterizer).super_Rasterizer._width <=
                  (int)(uVar32 + (int)lVar25))) goto LAB_00108f20;
              if ((iVar15 < 0) || ((this->super_CellRasterizer).super_Rasterizer._height <= iVar15))
              goto LAB_00108f3f;
              pCVar5 = pCVar4 + lVar21 + local_d8 + lVar25;
              pCVar5->cover = pCVar5->cover + (int)uVar11 * local_e0;
              piVar1 = &pCVar4[lVar21 + local_d8 + lVar25].area;
              *piVar1 = *piVar1 + iVar27 * local_e0;
              lVar29 = lVar28 + uVar18;
              uVar7 = 0;
              if (-1 < lVar29) {
                uVar7 = uVar24;
              }
              lVar28 = lVar29 - uVar7;
              uVar30 = (uint)(-1 < lVar29) + local_80;
              uVar11 = (ulong)uVar30;
              uVar31 = uVar31 + uVar30;
              iVar27 = uVar30 * 0x100;
              lVar25 = lVar25 + 1;
            } while ((local_d8 - uVar19) + lVar25 != 0);
            local_d8 = (ulong)(uVar32 + (int)lVar25);
          }
          if (((int)local_d8 < 0) ||
             ((this->super_CellRasterizer).super_Rasterizer._width <= (int)local_d8)) break;
          if ((iVar15 < 0) || ((this->super_CellRasterizer).super_Rasterizer._height <= iVar15))
          goto LAB_00108f3f;
          iVar27 = (local_dc - uVar31) + uVar30;
          lVar25 = (uVar37 & 0xffffffff) * this->_cellStride;
          pCVar5 = this->_cells;
          pCVar4 = pCVar5 + lVar25 + (local_d8 & 0xffffffff);
          pCVar4->cover = pCVar4->cover + iVar27 * local_e0;
          piVar1 = &pCVar5[lVar25 + (local_d8 & 0xffffffff)].area;
          *piVar1 = *piVar1 + uVar14 * local_e0 * iVar27;
          if ((local_a0 & 0xff) == 0) {
            uVar31 = uVar31 + local_80;
            lVar28 = lVar28 + uVar18;
            if (-1 < lVar28) {
              lVar28 = lVar28 - uVar24;
              uVar31 = uVar31 + 1;
            }
          }
          uVar37 = (ulong)(uint)(iVar15 + iVar13);
          iVar23 = iVar23 + -1;
          if (iVar23 == 0) {
            if (iVar15 + iVar13 == uVar22) {
              return;
            }
            do {
              iVar23 = iVar26;
              if (1 < iVar23) {
                iVar23 = iVar23 + -1;
                local_dc = 0x100;
                iVar26 = 1;
                break;
              }
              uVar7 = local_90 - local_a0;
              local_d8 = local_a0 >> 8;
              uVar33 = local_a0 & 0xff;
              uVar19 = (uint)uVar33;
              iVar26 = 1;
              local_dc = uVar35;
              if (0x100 < (int)((int)uVar7 + uVar19)) goto LAB_00108bb5;
              iVar27 = uVar35 * local_e0;
              iVar15 = ((int)uVar7 + uVar19 * 2) * iVar27;
              iVar23 = iVar23 + -1;
              iVar26 = 1;
LAB_00108ac8:
              iVar36 = (int)uVar37;
              this->_bits[(long)iVar36 * this->_bitStride + (local_d8 >> 9 & 0x7fffff)] =
                   this->_bits[(long)iVar36 * this->_bitStride + (local_d8 >> 9 & 0x7fffff)] |
                   1L << ((byte)(local_d8 >> 3) & 0x3f);
              if (((int)local_d8 < 0) ||
                 ((this->super_CellRasterizer).super_Rasterizer._width <= (int)local_d8))
              goto LAB_00108f20;
              if ((iVar36 < 0) || ((this->super_CellRasterizer).super_Rasterizer._height <= iVar36))
              goto LAB_00108f3f;
              lVar25 = (uVar37 & 0xffffffff) * this->_cellStride;
              pCVar5 = this->_cells;
              pCVar4 = pCVar5 + lVar25 + (local_d8 & 0xffffffff);
              pCVar4->cover = pCVar4->cover + iVar27;
              piVar1 = &pCVar5[lVar25 + (local_d8 & 0xffffffff)].area;
              *piVar1 = *piVar1 + iVar15;
              uVar37 = (ulong)(uint)(iVar36 + iVar13);
              if (iVar36 + iVar13 == uVar22) {
                return;
              }
              if (uVar19 + (int)uVar7 == 0x100) {
                uVar31 = uVar31 + local_80;
                lVar28 = lVar28 + uVar18;
                if (-1 < lVar28) {
                  lVar28 = lVar28 - uVar24;
                  uVar31 = uVar31 + 1;
                }
              }
            } while (iVar23 == 0);
          }
          lVar25 = local_a8 + uVar17;
          uVar7 = 0;
          if (-1 < lVar25) {
            uVar7 = uVar16;
          }
          local_a8 = lVar25 - uVar7;
          uVar7 = (-1 < lVar25) + uVar8;
          local_d8 = local_a0 >> 8;
          uVar33 = local_a0 & 0xff;
LAB_00108bb5:
          uVar31 = uVar31 - 0x100;
          uVar11 = (ulong)uVar31;
          if (0x100 < uVar31) {
            __assert_fail("cover >= 0 && cover <= 256",
                          "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                          ,0x1e0,
                          "void RasterizerA3<8>::_addLine(Fixed, Fixed, Fixed, Fixed) [N = 8, Fixed = long]"
                         );
          }
        }
LAB_00108f20:
        __assert_fail("x >= 0 && x < _width",
                      "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                      ,0x1f,"void RasterizerA3<8>::_mergeCell(int, int, int, int) [N = 8]");
      }
      uVar7 = uVar7 & 0xffffffff;
      if (0 < iVar26) {
        uVar7 = (ulong)((0x100 - uVar30) * local_e0);
      }
      pBVar3 = this->_bits;
      iVar23 = 1;
      while( true ) {
        pCVar4 = this->_cells;
        iVar27 = (int)uVar37;
        uVar37 = (ulong)iVar27;
        iVar27 = uVar22 - iVar27;
        do {
          puVar2 = (ulong *)((long)pBVar3 +
                            this->_bitStride * uVar37 * 8 +
                            (ulong)(((uint)(local_a0 >> 0x11) & 0x7fffff) << 3));
          *puVar2 = *puVar2 | 1L << ((byte)(local_a0 >> 0xb) & 0x3f);
          if (((int)uVar32 < 0) ||
             ((this->super_CellRasterizer).super_Rasterizer._width <= (int)uVar32))
          goto LAB_00108f20;
          if (((long)uVar37 < 0) ||
             ((long)(this->super_CellRasterizer).super_Rasterizer._height <= (long)uVar37))
          goto LAB_00108f3f;
          lVar28 = this->_cellStride * uVar37;
          pCVar5 = pCVar4 + (ulong)(uVar32 & 0x7fffffff) + lVar28;
          pCVar5->cover = pCVar5->cover + (int)uVar7;
          piVar1 = &pCVar4[(ulong)(uVar32 & 0x7fffffff) + lVar28].area;
          *piVar1 = *piVar1 + uVar19 * 2 * (int)uVar7;
          uVar37 = uVar37 + (long)iVar13;
          iVar27 = iVar27 - iVar13;
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
        if (iVar27 == 0) break;
        uVar31 = uVar35 * local_e0;
        if (1 < iVar26) {
          uVar31 = local_e0 << 8;
        }
        uVar7 = (ulong)uVar31;
        iVar23 = iVar26 - (uint)(1 < iVar26);
        iVar26 = 1;
      }
    }
  }
  return;
LAB_00108a3b:
  iVar23 = iVar26 + -1;
  uVar30 = 0;
  local_dc = 0x100;
  iVar26 = 1;
LAB_00108a5b:
  lVar21 = local_a8 + uVar17;
  uVar7 = 0;
  if (-1 < lVar21) {
    uVar7 = uVar16;
  }
  local_a8 = lVar21 - uVar7;
  uVar7 = (-1 < lVar21) + uVar8;
  uVar37 = lVar25 + iVar13;
  goto LAB_00108811;
}

Assistant:

void RasterizerA3<N>::_addLine(Fixed x0, Fixed y0, Fixed x1, Fixed y1) noexcept {
  Fixed dx = x1 - x0;
  Fixed dy = y1 - y0;

  if (dy == Fixed(0))
    return;

  int cover = int(dy);
  int area;

  if (dx < 0) dx = -dx;
  if (dy < 0) dy = -dy;

  int yInc = 1;
  int coverSign = 1;

  // Fix RIGHT-TO-LEFT direction:
  //   - swap coordinates,
  //   - invert cover-sign.
  if (x0 > x1) {
    std::swap(x0, x1);
    std::swap(y0, y1);
    coverSign = -coverSign;
  }

  // Fix BOTTOM-TO-TOP direction:
  //   - invert fractional parts of y0 and y1,
  //   - invert cover-sign.
  if (y0 > y1) {
    y0 ^= kA8Mask;
    y0 += int(y0 & kA8Mask) == kA8Mask ? 1 - kA8Scale * 2 : 1;
    y1  = y0 + dy;

    yInc = -1;
    coverSign = -coverSign;
  }

  // Extract the raster and fractional coordinates.
  int ex0 = int(x0 >> kA8Shift);
  int fx0 = int(x0 & kA8Mask);

  int ey0 = int(y0 >> kA8Shift);
  int fy0 = int(y0 & kA8Mask);

  int ex1 = int(x1 >> kA8Shift);
  int fy1 = int(y1 & kA8Mask);

  // NOTE: Variable `i` is just a loop counter. We need to make sure to handle
  // the start and end points of the line, which use the same loop body, but
  // require special handling.
  //
  //   - `i` - How many Y iterations to do now.
  //   - `j` - How many Y iterations to do next.
  int i = 1;
  int j = int(y1 >> kA8Shift) - ey0;

  // Single-Cell.
  if ((j | ((fx0 + int(dx)) > 256)) == 0) {
    _yBounds.union_(ey0, ey0);
    IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);

    _mergeCell(ex0, ey0, cover, (fx0 * 2 + int(dx)) * cover);
    return;
  }

  uint32_t ey1 = ey0 + (j + (fy1 != 0)) * yInc;
  if (ey0 <= ey1)
    _yBounds.union_(ey0, ey1);
  else
    _yBounds.union_(ey1, ey0);

  // Strictly horizontal line (always one cell per scanline).
  if (dx == 0) {
    if (j > 0)
      cover = (kA8Scale - fy0) * coverSign;

    fy0  = coverSign << kA8Shift;
    fy1 *= coverSign;
    fx0 *= 2;

    size_t bitIndex = ex0 / kPixelsPerOneBit;
    BitWord* bitBase = _bits + (bitIndex / kBitWordBits);
    BitWord bitMask = BitWord(1) << (bitIndex % kBitWordBits);

    for (;;) {
      area = fx0 * cover;
      do {
        bitBase[ey0 * _bitStride] |= bitMask;
        _mergeCell(ex0, ey0, cover, area);
        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

      cover = fy1;
      i = j;
      j = 1;

      if (i <= 1)
        continue;

      cover = fy0;
      i--;
    }

    return;
  }

  Fixed xErr = -dy / 2, xBase, xLift, xRem, xDlt = dx;
  Fixed yErr = -dx / 2, yBase, yLift, yRem, yDlt = dy;

  xBase = dx * kA8Scale;
  xLift = xBase / dy;
  xRem  = xBase % dy;

  yBase = dy * kA8Scale;
  yLift = yBase / dx;
  yRem  = yBase % dx;

  if (j != 0) {
    Fixed p = Fixed(kA8Scale - fy0) * dx;
    xDlt  = p / dy;
    xErr += p % dy;
    fy1 = kA8Scale;
  }

  if (ex0 != ex1) {
    Fixed p = Fixed(kA8Scale - fx0) * dy;
    yDlt = p / dx;
    yErr += p % dx;
  }

  // Vertical direction -> One/Two cells per scanline.
  if (dy >= dx) {
    int yAcc = int(y0) + int(yDlt);

    goto VertSkip;
    for (;;) {
      do {
        xDlt = xLift;
        xErr += xRem;
        if (xErr >= 0) { xErr -= dy; xDlt++; }

VertSkip:
        area = fx0;
        fx0 += int(xDlt);

        if (fx0 <= 256) {
          cover = (fy1 - fy0) * coverSign;
          area  = (area + fx0) * cover;

          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);

          if (fx0 == 256) {
            ex0++;
            fx0 = 0;
            goto VertAdvance;
          }
        }
        else {
          yAcc &= 0xFF;
          fx0  &= kA8Mask;

          cover = (yAcc - fy0) * coverSign;
          area  = (area + kA8Scale) * cover;

          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);
          ex0++;

          cover = (fy1 - yAcc) * coverSign;
          area  = fx0 * cover;
          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);

VertAdvance:
          yAcc += int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; yAcc++; }
        }

        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

      i = j;
      j = 1;

      if (i > 1) {
        fy0 = 0;
        fy1 = kA8Scale;
        i--;
      }
      else {
        fy0 = 0;
        fy1 = int(y1 & kA8Mask);

        xDlt = x1 - (ex0 << 8) - fx0;
        goto VertSkip;
      }
    }

    return;
  }
  // Horizontal direction -> Two or more cells per scanline.
  else {
    int fx1;
    int coverAcc = fy0;

    cover = int(yDlt);
    coverAcc += cover;

    if (j != 0)
      fy1 = kA8Scale;

    if (fx0 + int(xDlt) > 256)
      goto HorzInside;

    x0 += xDlt;

    cover = (fy1 - fy0) * coverSign;
    area = (fx0 * 2 + int(xDlt)) * cover;

HorzSingle:
    IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
    _mergeCell(ex0, ey0, cover, area);

    ey0 += yInc;
    if (ey0 == ey1)
      return;

    if (fx0 + int(xDlt) == 256) {
      coverAcc += int(yLift);
      yErr += yRem;
      if (yErr >= 0) { yErr -= dx; coverAcc++; }
    }

    if (--i == 0)
      goto HorzAfter;

    for (;;) {
      do {
        xDlt = xLift;
        xErr += xRem;
        if (xErr >= 0) { xErr -= dy; xDlt++; }

        ex0 = int(x0 >> kA8Shift);
        fx0 = int(x0 & kA8Mask);

HorzSkip:
        coverAcc -= 256;
        cover = coverAcc;
        assert(cover >= 0 && cover <= 256);

HorzInside:
        x0 += xDlt;

        ex1 = int(x0 >> kA8Shift);
        fx1 = int(x0 & kA8Mask);
        assert(ex0 != ex1);

        if (fx1 == 0)
          fx1 = kA8Scale;
        else
          ex1++;

        area = (fx0 + kA8Scale) * cover;
        IntUtils::bitVectorFill(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, (ex1 / kPixelsPerOneBit) - (ex0 / kPixelsPerOneBit) + 1);

        while (ex0 != ex1 - 1) {
          _mergeCell(ex0, ey0, cover * coverSign, area * coverSign);

          cover = int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; cover++; }

          coverAcc += cover;
          area  = kA8Scale * cover;

          ex0++;
        }

        cover += fy1 - coverAcc;
        area   = fx1 * cover;
        _mergeCell(ex0, ey0, cover * coverSign, area * coverSign);

        if (fx1 == kA8Scale) {
          coverAcc += int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; coverAcc++; }
        }

        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

HorzAfter:
      i = j;
      j = 1;

      if (i > 1) {
        fy1 = kA8Scale;
        i--;
      }
      else {
        fy1 = int(y1 & kA8Mask);
        xDlt = x1 - x0;

        ex0 = int(x0 >> kA8Shift);
        fx0 = int(x0 & kA8Mask);

        if (fx0 + int(xDlt) <= 256) {
          cover = fy1 * coverSign;
          area = (fx0 * 2 + int(xDlt)) * cover;
          goto HorzSingle;
        }
        else {
          goto HorzSkip;
        }
      }
    }

    return;
  }
}